

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O3

Pool<A,_8192UL> * __thiscall entityx::EntityManager::accomodate_component<A>(EntityManager *this)

{
  iterator __position;
  Family FVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *this_00;
  char *chunk;
  value_type local_48;
  vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *local_40;
  Family local_38;
  
  FVar1 = Component<A>::family();
  this_00 = (vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)(this + 0x18);
  lVar4 = *(long *)(this + 0x18);
  if ((ulong)(*(long *)(this + 0x20) - lVar4 >> 3) <= FVar1) {
    local_48 = (value_type)0x0;
    Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::resize
              (this_00,FVar1 + 1,&local_48);
    lVar4 = *(long *)this_00;
  }
  if (*(long *)(lVar4 + FVar1 * 8) == 0) {
    local_40 = this_00;
    puVar2 = (undefined8 *)operator_new(0x40);
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 1;
    puVar2[5] = 0x2000;
    puVar2[6] = 0;
    puVar2[7] = 0;
    *puVar2 = &PTR__BasePool_001cfd80;
    uVar5 = (ulong)*(uint *)(this + 8);
    if (uVar5 != 0) {
      lVar4 = 0x2000;
      uVar3 = 0;
      local_38 = FVar1;
      do {
        local_48 = (value_type)operator_new__(puVar2[4] * lVar4);
        __position._M_current = (char **)puVar2[2];
        if (__position._M_current == (char **)puVar2[3]) {
          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                    ((vector<char*,std::allocator<char*>> *)(puVar2 + 1),__position,
                     (char **)&local_48);
          lVar4 = puVar2[5];
          uVar3 = puVar2[7];
        }
        else {
          *__position._M_current = (char *)local_48;
          puVar2[2] = puVar2[2] + 8;
        }
        uVar3 = uVar3 + lVar4;
        puVar2[7] = uVar3;
      } while (uVar3 < uVar5);
      lVar4 = *(long *)local_40;
      FVar1 = local_38;
    }
    puVar2[6] = uVar5;
    *(undefined8 **)(lVar4 + FVar1 * 8) = puVar2;
    this_00 = local_40;
  }
  lVar4 = *(long *)(this + 0x30);
  if ((ulong)(*(long *)(this + 0x38) - lVar4 >> 3) <= FVar1) {
    local_48 = (value_type)0x0;
    Catch::clara::std::
    vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::resize
              ((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                *)(this + 0x30),FVar1 + 1,(value_type *)&local_48);
    lVar4 = *(long *)(this + 0x30);
  }
  if (*(long *)(lVar4 + FVar1 * 8) == 0) {
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = &PTR__BaseComponentHelper_001cfdc0;
    *(undefined8 **)(lVar4 + FVar1 * 8) = puVar2;
  }
  return *(Pool<A,_8192UL> **)(*(long *)this_00 + FVar1 * 8);
}

Assistant:

Pool<C> *accomodate_component() {
    BaseComponent::Family family = component_family<C>();
    if (component_pools_.size() <= family) {
      component_pools_.resize(family + 1, nullptr);
    }
    if (!component_pools_[family]) {
      Pool<C> *pool = new Pool<C>();
      pool->expand(index_counter_);
      component_pools_[family] = pool;
    }
    if (component_helpers_.size() <= family) {
      component_helpers_.resize(family + 1, nullptr);
    }
    if (!component_helpers_[family]) {
      ComponentHelper<C> *helper = new ComponentHelper<C>();
      component_helpers_[family] = helper;
    }
    return static_cast<Pool<C>*>(component_pools_[family]);
  }